

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode SUNQRAdd_CGS2(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  N_Vector in_R9;
  sunrealtype sVar1;
  SUNQRData qrdata;
  sunindextype j;
  SUNContext_conflict sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector x;
  N_Vector in_stack_ffffffffffffffc8;
  long lVar2;
  
  sVar1 = *(sunrealtype *)(*in_RDI + 0x10);
  N_VScale((sunrealtype)in_R9,in_stack_ffffffffffffffb8,(N_Vector)0x111126);
  if (0 < in_ECX) {
    N_VDotProdMulti((int)((ulong)sVar1 >> 0x20),in_stack_ffffffffffffffc8,(N_Vector *)in_R9,
                    (sunrealtype *)in_stack_ffffffffffffffb8);
    N_VLinearCombination
              ((int)((ulong)sVar1 >> 0x20),(sunrealtype *)in_stack_ffffffffffffffc8,
               (N_Vector *)in_R9,in_stack_ffffffffffffffb8);
    N_VLinearSum(sVar1,in_stack_ffffffffffffffc8,(sunrealtype)in_R9,in_stack_ffffffffffffffb8,
                 (N_Vector)0x1111bb);
    N_VDotProdMulti((int)((ulong)sVar1 >> 0x20),in_stack_ffffffffffffffc8,(N_Vector *)in_R9,
                    (sunrealtype *)in_stack_ffffffffffffffb8);
    N_VLinearCombination
              ((int)((ulong)sVar1 >> 0x20),(sunrealtype *)in_stack_ffffffffffffffc8,
               (N_Vector *)in_R9,in_stack_ffffffffffffffb8);
    N_VLinearSum(sVar1,in_stack_ffffffffffffffc8,(sunrealtype)in_R9,in_stack_ffffffffffffffb8,
                 (N_Vector)0x111234);
    for (lVar2 = 0; lVar2 < in_ECX; lVar2 = lVar2 + 1) {
      *(double *)(in_RSI + (in_ECX * in_R8D + lVar2) * 8) =
           *(double *)(in_RSI + (in_ECX * in_R8D + lVar2) * 8) +
           (double)(&in_R9->sunctx->profiler)[lVar2];
    }
  }
  sVar1 = N_VDotProd(in_R9,in_stack_ffffffffffffffb8);
  *(sunrealtype *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = sVar1;
  if (0.0 < *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8)) {
    x = (N_Vector)sqrt(*(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8));
  }
  else {
    x = (N_Vector)0x0;
  }
  *(N_Vector *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = x;
  N_VScale((sunrealtype)in_R9,x,(N_Vector)0x11137f);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_CGS2(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                         int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* temp = df */

  if (m > 0)
  {
    /* s_k = Q_k-1^T df_aa -- update with sdata as a sunrealtype* array */
    SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax));

    /* y = df - Q_k-1 s_k */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp2);
    SUNCheckLastErr();

    /* z_k = Q_k-1^T y */
    SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp2, Q, qrdata->temp_array));

    /* df = y - Q_k-1 z_k */
    SUNCheckCall(N_VLinearCombination(m, qrdata->temp_array, Q, Q[m]));
    N_VLinearSum(ONE, qrdata->vtemp2, -ONE, Q[m], qrdata->vtemp);
    SUNCheckLastErr();

    /* R(1:k-1,k) = s_k + z_k */
    for (j = 0; j < m; j++)
    {
      R[m * mMax + j] = R[m * mMax + j] + qrdata->temp_array[j];
    }
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / R(k,k) */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}